

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LRUMap.hh
# Opt level: O3

void __thiscall
phosg::
LRUMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::touch_item(LRUMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *this,Item *item)

{
  Item *pIVar1;
  
  if (this->head != item) {
    unlink_item(this,item);
    pIVar1 = this->head;
    item->next = pIVar1;
    if (pIVar1 != (Item *)0x0) {
      pIVar1->prev = item;
    }
    this->head = item;
    if (this->tail == (Item *)0x0) {
      this->tail = item;
    }
  }
  return;
}

Assistant:

void touch_item(Item& item) const {
    if (this->head != &item) {
      this->unlink_item(&item);
      this->link_item(&item);
    }
  }